

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findOrCreateNodeOfSize(MemoryAccountant *this,size_t size)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *local_28;
  MemoryAccountantAllocationNode *node;
  size_t size_local;
  MemoryAccountant *this_local;
  
  if ((this->useCacheSizes_ & 1U) == 0) {
    if ((this->head_ != (MemoryAccountantAllocationNode *)0x0) && (size < this->head_->size_)) {
      pMVar1 = createNewAccountantAllocationNode(this,size,this->head_);
      this->head_ = pMVar1;
    }
    for (local_28 = this->head_; local_28 != (MemoryAccountantAllocationNode *)0x0;
        local_28 = local_28->next_) {
      if (local_28->size_ == size) {
        return local_28;
      }
      if ((local_28->next_ == (MemoryAccountantAllocationNode *)0x0) ||
         (size < local_28->next_->size_)) {
        pMVar1 = createNewAccountantAllocationNode(this,size,local_28->next_);
        local_28->next_ = pMVar1;
      }
    }
    pMVar1 = createNewAccountantAllocationNode(this,size,this->head_);
    this->head_ = pMVar1;
    this_local = (MemoryAccountant *)this->head_;
  }
  else {
    this_local = (MemoryAccountant *)findNodeOfSize(this,size);
  }
  return (MemoryAccountantAllocationNode *)this_local;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findOrCreateNodeOfSize(size_t size)
{
    if (useCacheSizes_)
      return findNodeOfSize(size);

    if (head_ && head_->size_ > size)
        head_ = createNewAccountantAllocationNode(size, head_);

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
        if (node->size_ == size)
            return node;
        if (node->next_ == NULLPTR || node->next_->size_ > size)
            node->next_ = createNewAccountantAllocationNode(size, node->next_);
    }
    head_ = createNewAccountantAllocationNode(size, head_);
    return head_;
}